

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O0

TorsionType * __thiscall
OpenMD::ForceField::getTorsionType(ForceField *this,string *at1,string *at2,string *at3,string *at4)

{
  bool bVar1;
  KeyType *keys_00;
  ElemPtr this_00;
  ElemPtr pTVar2;
  AtomType *in_RDI;
  TorsionType *bestType_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  theKeys_1;
  TorsionType *torsionType_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  myKeys_1;
  TorsionType *bestType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  theKeys;
  TorsionType *torsionType_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  myKeys;
  vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  foundTorsions;
  int JKscore;
  int ILscore;
  int ll;
  int kk;
  int jj;
  int ii;
  iterator l;
  iterator k;
  iterator j;
  iterator i;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at4Chain;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at3Chain;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at2Chain;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at1Chain;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at4key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at3key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at2key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at1key;
  AtomType *atype4;
  AtomType *atype3;
  AtomType *atype2;
  AtomType *atype1;
  TorsionType *torsionType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  AtomType *in_stack_fffffffffffffb78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb80;
  __normal_iterator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  in_stack_fffffffffffffb88;
  __normal_iterator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  __last;
  __normal_iterator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  in_stack_fffffffffffffb90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  KeyType *in_stack_fffffffffffffbf0;
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string *in_stack_fffffffffffffce0;
  KeyType *in_stack_fffffffffffffce8;
  TypeContainer<OpenMD::TorsionType,_4> *in_stack_fffffffffffffcf0;
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [56];
  AtomType **local_1d8;
  AtomType **local_1d0;
  AtomType **local_1c8;
  AtomType **local_1c0;
  AtomType **local_1b8;
  AtomType **local_1b0;
  AtomType **local_1a8;
  AtomType **local_1a0;
  tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  local_168;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  local_160;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  local_158;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  local_150 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0 [3];
  ElemPtr local_88;
  ElemPtr local_80;
  ElemPtr local_78;
  ElemPtr local_70;
  undefined4 local_64;
  KeyType *local_60;
  KeyType *local_8;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2268f4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffb90._M_current,
              (value_type *)in_stack_fffffffffffffb88._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffb90._M_current,
              (value_type *)in_stack_fffffffffffffb88._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffb90._M_current,
              (value_type *)in_stack_fffffffffffffb88._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffb90._M_current,
              (value_type *)in_stack_fffffffffffffb88._M_current);
  keys_00 = (KeyType *)
            TypeContainer<OpenMD::TorsionType,_4>::find
                      ((TypeContainer<OpenMD::TorsionType,_4> *)in_RDI,in_stack_fffffffffffffbf0);
  local_60 = keys_00;
  if (keys_00 == (KeyType *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x2269d6);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb90._M_current,
                (value_type *)in_stack_fffffffffffffb88._M_current);
    local_70 = TypeContainer<OpenMD::AtomType,_1>::find
                         ((TypeContainer<OpenMD::AtomType,_1> *)in_RDI,keys_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x226a29);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb90._M_current,
                (value_type *)in_stack_fffffffffffffb88._M_current);
    this_00 = TypeContainer<OpenMD::AtomType,_1>::find
                        ((TypeContainer<OpenMD::AtomType,_1> *)in_RDI,keys_00);
    __x = local_d0;
    local_78 = this_00;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x226a7c);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb90._M_current,
                (value_type *)in_stack_fffffffffffffb88._M_current);
    local_80 = TypeContainer<OpenMD::AtomType,_1>::find
                         ((TypeContainer<OpenMD::AtomType,_1> *)in_RDI,keys_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x226acf);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb90._M_current,
                (value_type *)in_stack_fffffffffffffb88._M_current);
    local_88 = TypeContainer<OpenMD::AtomType,_1>::find
                         ((TypeContainer<OpenMD::AtomType,_1> *)in_RDI,keys_00);
    AtomType::allYourBase(in_RDI);
    AtomType::allYourBase(in_RDI);
    AtomType::allYourBase(in_RDI);
    AtomType::allYourBase(in_RDI);
    __gnu_cxx::
    __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
    ::__normal_iterator(local_150);
    __gnu_cxx::
    __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
    ::__normal_iterator(&local_158);
    __gnu_cxx::
    __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
    ::__normal_iterator(&local_160);
    __gnu_cxx::
    __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
    ::__normal_iterator(&local_168);
    local_16c = 0;
    local_170 = 0;
    local_174 = 0;
    local_178 = 0;
    std::
    vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::vector((vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              *)0x226bd9);
    local_1a0 = (AtomType **)
                std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::begin
                          ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                           in_stack_fffffffffffffb78);
    local_158._M_current = local_1a0;
    while( true ) {
      local_1a8 = (AtomType **)
                  std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::end
                            ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                             in_stack_fffffffffffffb78);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                          *)in_stack_fffffffffffffb80,
                         (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                          *)in_stack_fffffffffffffb78);
      if (!bVar1) break;
      local_174 = 0;
      local_1b0 = (AtomType **)
                  std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::begin
                            ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                             in_stack_fffffffffffffb78);
      local_160._M_current = local_1b0;
      while( true ) {
        local_1b8 = (AtomType **)
                    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::end
                              ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                               in_stack_fffffffffffffb78);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                            *)in_stack_fffffffffffffb80,
                           (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                            *)in_stack_fffffffffffffb78);
        if (!bVar1) break;
        local_16c = 0;
        local_1c0 = (AtomType **)
                    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::begin
                              ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                               in_stack_fffffffffffffb78);
        local_150[0]._M_current = local_1c0;
        while( true ) {
          local_1c8 = (AtomType **)
                      std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::end
                                ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                                 in_stack_fffffffffffffb78);
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                              *)in_stack_fffffffffffffb80,
                             (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                              *)in_stack_fffffffffffffb78);
          if (!bVar1) break;
          local_178 = 0;
          local_1d0 = (AtomType **)
                      std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::begin
                                ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                                 in_stack_fffffffffffffb78);
          local_168._M_current = local_1d0;
          while( true ) {
            local_1d8 = (AtomType **)
                        std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::end
                                  ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                    *)in_stack_fffffffffffffb78);
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                                *)in_stack_fffffffffffffb80,
                               (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                                *)in_stack_fffffffffffffb78);
            if (!bVar1) break;
            local_198.
            super__Tuple_impl<0UL,_int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .
            super__Tuple_impl<1UL,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._28_4_ = local_16c + local_178;
            local_198.
            super__Tuple_impl<0UL,_int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .
            super__Tuple_impl<1UL,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .super__Head_base<1UL,_int,_false>._M_head_impl = local_170 + local_174;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x226d95);
            __gnu_cxx::
            __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
            ::operator*(local_150);
            AtomType::getName_abi_cxx11_(in_stack_fffffffffffffb78);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
            std::__cxx11::string::~string(local_210);
            __gnu_cxx::
            __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
            ::operator*(&local_158);
            AtomType::getName_abi_cxx11_(in_stack_fffffffffffffb78);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
            std::__cxx11::string::~string(local_230);
            __gnu_cxx::
            __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
            ::operator*(&local_160);
            AtomType::getName_abi_cxx11_(in_stack_fffffffffffffb78);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
            std::__cxx11::string::~string(local_250);
            __gnu_cxx::
            __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
            ::operator*(&local_168);
            AtomType::getName_abi_cxx11_(in_stack_fffffffffffffb78);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
            std::__cxx11::string::~string(local_270);
            pTVar2 = TypeContainer<OpenMD::TorsionType,_4>::find
                               ((TypeContainer<OpenMD::TorsionType,_4> *)in_RDI,keys_00);
            if (pTVar2 != (ElemPtr)0x0) {
              std::
              make_tuple<int&,int&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                        ((int *)in_stack_fffffffffffffb88._M_current,
                         (int *)in_stack_fffffffffffffb80,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffb78);
              std::
              vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::push_back((vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           *)in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
              std::
              tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~tuple((tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)0x226f2b);
            }
            local_178 = local_178 + 1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffb90._M_current);
            __gnu_cxx::
            __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
            ::operator++(&local_168);
          }
          local_16c = local_16c + 1;
          __gnu_cxx::
          __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
          ::operator++(local_150);
        }
        local_174 = local_174 + 1;
        __gnu_cxx::
        __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
        ::operator++(&local_160);
      }
      local_170 = local_170 + 1;
      __gnu_cxx::
      __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
      ::operator++(&local_158);
    }
    bVar1 = std::
            vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::empty((vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)in_stack_fffffffffffffb90._M_current);
    if (bVar1) {
      local_158._M_current =
           (AtomType **)
           std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::begin
                     ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                      in_stack_fffffffffffffb78);
      while( true ) {
        std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::end
                  ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                   in_stack_fffffffffffffb78);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                            *)in_stack_fffffffffffffb80,
                           (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                            *)in_stack_fffffffffffffb78);
        if (!bVar1) break;
        local_174 = 0;
        local_160._M_current =
             (AtomType **)
             std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::begin
                       ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                        in_stack_fffffffffffffb78);
        while( true ) {
          std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::end
                    ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                     in_stack_fffffffffffffb78);
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                              *)in_stack_fffffffffffffb80,
                             (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                              *)in_stack_fffffffffffffb78);
          if (!bVar1) break;
          local_16c = 0;
          local_150[0]._M_current =
               (AtomType **)
               std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::begin
                         ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                          in_stack_fffffffffffffb78);
          while( true ) {
            std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::end
                      ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                       in_stack_fffffffffffffb78);
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                                *)in_stack_fffffffffffffb80,
                               (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                                *)in_stack_fffffffffffffb78);
            if (!bVar1) break;
            local_178 = 0;
            local_168._M_current =
                 (AtomType **)
                 std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::begin
                           ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                            in_stack_fffffffffffffb78);
            while( true ) {
              std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::end
                        ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                         in_stack_fffffffffffffb78);
              bVar1 = __gnu_cxx::operator!=
                                ((__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                                  *)in_stack_fffffffffffffb80,
                                 (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                                  *)in_stack_fffffffffffffb78);
              if (!bVar1) break;
              local_198.
              super__Tuple_impl<0UL,_int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Tuple_impl<1UL,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._28_4_ = local_16c + local_178;
              local_198.
              super__Tuple_impl<0UL,_int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Tuple_impl<1UL,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .super__Head_base<1UL,_int,_false>._M_head_impl = local_170 + local_174;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x227433);
              __gnu_cxx::
              __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
              ::operator*(local_150);
              AtomType::getName_abi_cxx11_(in_stack_fffffffffffffb78);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
              std::__cxx11::string::~string(local_340);
              __gnu_cxx::
              __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
              ::operator*(&local_158);
              AtomType::getName_abi_cxx11_(in_stack_fffffffffffffb78);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
              std::__cxx11::string::~string(local_360);
              __gnu_cxx::
              __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
              ::operator*(&local_160);
              AtomType::getName_abi_cxx11_(in_stack_fffffffffffffb78);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
              std::__cxx11::string::~string(local_380);
              __gnu_cxx::
              __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
              ::operator*(&local_168);
              AtomType::getName_abi_cxx11_(in_stack_fffffffffffffb78);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
              std::__cxx11::string::~string(local_3a0);
              in_stack_fffffffffffffb90._M_current =
                   (tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)TypeContainer<OpenMD::TorsionType,_4>::find
                                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                                 in_stack_fffffffffffffce0);
              if (in_stack_fffffffffffffb90._M_current !=
                  (tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x0) {
                std::
                make_tuple<int&,int&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                          ((int *)in_stack_fffffffffffffb88._M_current,
                           (int *)in_stack_fffffffffffffb80,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffb78);
                std::
                vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::push_back((vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                             *)in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
                std::
                tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~tuple((tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)0x2275d3);
              }
              local_178 = local_178 + 1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffb90._M_current);
              __gnu_cxx::
              __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
              ::operator++(&local_168);
            }
            local_16c = local_16c + 1;
            __gnu_cxx::
            __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
            ::operator++(local_150);
          }
          local_174 = local_174 + 1;
          __gnu_cxx::
          __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
          ::operator++(&local_160);
        }
        local_170 = local_170 + 1;
        __gnu_cxx::
        __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
        ::operator++(&local_158);
      }
      bVar1 = std::
              vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::empty((vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)in_stack_fffffffffffffb90._M_current);
      if (bVar1) {
        local_8 = (KeyType *)0x0;
        local_64 = 1;
      }
      else {
        __last._M_current = &local_198;
        std::
        vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::begin((vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)in_stack_fffffffffffffb78);
        std::
        vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::end((vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)in_stack_fffffffffffffb78);
        std::
        sort<__gnu_cxx::__normal_iterator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>*,std::vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>>
                  (in_stack_fffffffffffffb90,__last);
        std::
        vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::operator[]((vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)&local_198,0);
        std::get<2ul,int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x2277c2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00,__x);
        local_8 = (KeyType *)
                  TypeContainer<OpenMD::TorsionType,_4>::find
                            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                             in_stack_fffffffffffffce0);
        local_64 = 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffb90._M_current);
      }
    }
    else {
      std::
      vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::begin((vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)in_stack_fffffffffffffb78);
      std::
      vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::end((vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             *)in_stack_fffffffffffffb78);
      std::
      sort<__gnu_cxx::__normal_iterator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>*,std::vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>>
                (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      std::
      vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::operator[]((vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)&local_198,0);
      std::get<2ul,int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x2271c9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00,__x);
      local_8 = (KeyType *)
                TypeContainer<OpenMD::TorsionType,_4>::find
                          ((TypeContainer<OpenMD::TorsionType,_4> *)in_RDI,keys_00);
      local_64 = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb90._M_current);
    }
    std::
    vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~vector((vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)in_stack_fffffffffffffb90._M_current);
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector
              ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
               in_stack_fffffffffffffb90._M_current);
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector
              ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
               in_stack_fffffffffffffb90._M_current);
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector
              ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
               in_stack_fffffffffffffb90._M_current);
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector
              ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
               in_stack_fffffffffffffb90._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffb90._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffb90._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffb90._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffb90._M_current);
  }
  else {
    local_64 = 1;
    local_8 = keys_00;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffb90._M_current);
  return (TorsionType *)local_8;
}

Assistant:

TorsionType* ForceField::getTorsionType(const std::string& at1,
                                          const std::string& at2,
                                          const std::string& at3,
                                          const std::string& at4) {
    std::vector<std::string> keys;
    keys.push_back(at1);
    keys.push_back(at2);
    keys.push_back(at3);
    keys.push_back(at4);

    // try exact match first
    TorsionType* torsionType = torsionTypeCont_.find(keys);
    if (torsionType) {
      return torsionType;
    } else {
      AtomType* atype1;
      AtomType* atype2;
      AtomType* atype3;
      AtomType* atype4;
      std::vector<std::string> at1key;
      at1key.push_back(at1);
      atype1 = atomTypeCont_.find(at1key);

      std::vector<std::string> at2key;
      at2key.push_back(at2);
      atype2 = atomTypeCont_.find(at2key);

      std::vector<std::string> at3key;
      at3key.push_back(at3);
      atype3 = atomTypeCont_.find(at3key);

      std::vector<std::string> at4key;
      at4key.push_back(at4);
      atype4 = atomTypeCont_.find(at4key);

      // query atom types for their chains of responsibility
      std::vector<AtomType*> at1Chain = atype1->allYourBase();
      std::vector<AtomType*> at2Chain = atype2->allYourBase();
      std::vector<AtomType*> at3Chain = atype3->allYourBase();
      std::vector<AtomType*> at4Chain = atype4->allYourBase();

      std::vector<AtomType*>::iterator i;
      std::vector<AtomType*>::iterator j;
      std::vector<AtomType*>::iterator k;
      std::vector<AtomType*>::iterator l;

      int ii = 0;
      int jj = 0;
      int kk = 0;
      int ll = 0;
      int ILscore;
      int JKscore;

      std::vector<std::tuple<int, int, std::vector<std::string>>> foundTorsions;

      for (j = at2Chain.begin(); j != at2Chain.end(); ++j) {
        kk = 0;
        for (k = at3Chain.begin(); k != at3Chain.end(); ++k) {
          ii = 0;
          for (i = at1Chain.begin(); i != at1Chain.end(); ++i) {
            ll = 0;
            for (l = at4Chain.begin(); l != at4Chain.end(); ++l) {
              ILscore = ii + ll;
              JKscore = jj + kk;

              std::vector<std::string> myKeys;
              myKeys.push_back((*i)->getName());
              myKeys.push_back((*j)->getName());
              myKeys.push_back((*k)->getName());
              myKeys.push_back((*l)->getName());

              TorsionType* torsionType = torsionTypeCont_.find(myKeys);
              if (torsionType) {
                foundTorsions.push_back(
                    std::make_tuple(JKscore, ILscore, myKeys));
              }
              ll++;
            }
            ii++;
          }
          kk++;
        }
        jj++;
      }

      if (!foundTorsions.empty()) {
        std::sort(foundTorsions.begin(), foundTorsions.end());
        std::vector<std::string> theKeys = std::get<2>(foundTorsions[0]);

        TorsionType* bestType = torsionTypeCont_.find(theKeys);
        return bestType;
      } else {
        // if no exact match found, try wild card match

        for (j = at2Chain.begin(); j != at2Chain.end(); ++j) {
          kk = 0;
          for (k = at3Chain.begin(); k != at3Chain.end(); ++k) {
            ii = 0;
            for (i = at1Chain.begin(); i != at1Chain.end(); ++i) {
              ll = 0;
              for (l = at4Chain.begin(); l != at4Chain.end(); ++l) {
                ILscore = ii + ll;
                JKscore = jj + kk;

                std::vector<std::string> myKeys;
                myKeys.push_back((*i)->getName());
                myKeys.push_back((*j)->getName());
                myKeys.push_back((*k)->getName());
                myKeys.push_back((*l)->getName());

                TorsionType* torsionType =
                    torsionTypeCont_.find(myKeys, wildCardAtomTypeName_);
                if (torsionType) {
                  foundTorsions.push_back(
                      std::make_tuple(JKscore, ILscore, myKeys));
                }
                ll++;
              }
              ii++;
            }
            kk++;
          }
          jj++;
        }

        if (!foundTorsions.empty()) {
          std::sort(foundTorsions.begin(), foundTorsions.end());
          std::vector<std::string> theKeys = std::get<2>(foundTorsions[0]);
          TorsionType* bestType =
              torsionTypeCont_.find(theKeys, wildCardAtomTypeName_);

          return bestType;
        } else {
          return NULL;
        }
      }
    }
  }